

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O3

void __thiscall cppnet::BlockMemoryPool::Expansion(BlockMemoryPool *this,uint32_t num)

{
  pointer *pppvVar1;
  iterator __position;
  void *in_RAX;
  void *mem;
  void *local_28;
  
  if (num == 0) {
    num = this->_number_large_add_nodes;
  }
  if (num != 0) {
    local_28 = in_RAX;
    do {
      local_28 = malloc((ulong)this->_large_size);
      __position._M_current =
           (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((vector<void*,std::allocator<void*>> *)&this->_free_mem_vec,__position,&local_28)
        ;
      }
      else {
        *__position._M_current = local_28;
        pppvVar1 = &(this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      num = num - 1;
    } while (num != 0);
  }
  return;
}

Assistant:

void BlockMemoryPool::Expansion(uint32_t num) {
    if (num == 0) {
        num = _number_large_add_nodes;
    }

    for (uint32_t i = 0; i < num; ++i) {
        void* mem = malloc(_large_size);
        // not memset!
        _free_mem_vec.push_back(mem);
    }
}